

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O0

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::assign2product4setup<double,double>
          (SSVectorBase<double> *this,SVSetBase<double> *A,SSVectorBase<double> *x,Timer *timeSparse
          ,Timer *timeFull,int *nCallsSparse,int *nCallsFull)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  SSVectorBase<double> *in_RCX;
  SVSetBase<double> *in_RDX;
  SVSetBase<double> *in_RSI;
  SSVectorBase<double> *in_RDI;
  long *in_R8;
  int *in_R9;
  double dVar5;
  int *in_stack_00000008;
  SSVectorBase<double> *in_stack_00000058;
  SSVectorBase<double> *in_stack_ffffffffffffffb0;
  SSVectorBase<double> *this_00;
  
  this_00 = in_RDI;
  clear(in_stack_ffffffffffffffb0);
  iVar2 = size((SSVectorBase<double> *)0x24a430);
  if (iVar2 == 1) {
    if (in_RCX != (SSVectorBase<double> *)0x0) {
      (*(in_RCX->super_IdxSet)._vptr_IdxSet[3])();
    }
    assign2product1<double,double>((SSVectorBase<double> *)in_RSI,in_RDX,in_RCX);
    in_RDI->setupStatus = true;
    if (in_RCX != (SSVectorBase<double> *)0x0) {
      (*(in_RCX->super_IdxSet)._vptr_IdxSet[4])();
    }
    *in_R9 = *in_R9 + 1;
  }
  else {
    bVar1 = isSetup(in_RDI);
    if (bVar1) {
      iVar2 = size((SSVectorBase<double> *)0x24a4a6);
      dVar5 = (double)iVar2;
      iVar2 = SVSetBase<double>::memSize((SVSetBase<double> *)0x24a4ba);
      iVar3 = dim((SSVectorBase<double> *)0x24a4d8);
      iVar4 = SVSetBase<double>::num((SVSetBase<double> *)0x24a4f8);
      if (dVar5 * (double)iVar2 <= (double)iVar3 * 0.5 * (double)iVar4) {
        if (in_RCX != (SSVectorBase<double> *)0x0) {
          (*(in_RCX->super_IdxSet)._vptr_IdxSet[3])();
        }
        assign2productShort<double,double>
                  (in_stack_00000058,(SVSetBase<double> *)this,(SSVectorBase<double> *)A);
        in_RDI->setupStatus = true;
        if (in_RCX != (SSVectorBase<double> *)0x0) {
          (*(in_RCX->super_IdxSet)._vptr_IdxSet[4])();
        }
        *in_R9 = *in_R9 + 1;
        return in_RDI;
      }
    }
    if (in_R8 != (long *)0x0) {
      (**(code **)(*in_R8 + 0x18))();
    }
    assign2productFull<double,double>(this_00,in_RSI,(SSVectorBase<double> *)in_RDX);
    in_RDI->setupStatus = false;
    if (in_R8 != (long *)0x0) {
      (**(code **)(*in_R8 + 0x20))();
    }
    *in_stack_00000008 = *in_stack_00000008 + 1;
  }
  return in_RDI;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product4setup(const SVSetBase<S>& A,
      const SSVectorBase<T>& x,
      Timer* timeSparse, Timer* timeFull,
      int& nCallsSparse, int& nCallsFull
                                                      )
{
   assert(A.num() == x.dim());
   assert(x.isSetup());
   clear();

   if(x.size() == 1)
   {
      if(timeSparse != nullptr)
         timeSparse->start();

      assign2product1(A, x);
      setupStatus = true;

      if(timeSparse != nullptr)
         timeSparse->stop();

      ++nCallsSparse;
   }
   else if(isSetup()
           && (double(x.size()) * A.memSize() <= SOPLEX_SHORTPRODUCT_FACTOR * dim() * A.num()))
   {
      if(timeSparse != nullptr)
         timeSparse->start();

      assign2productShort(A, x);
      setupStatus = true;

      if(timeSparse != nullptr)
         timeSparse->stop();

      ++nCallsSparse;
   }
   else
   {
      if(timeFull != nullptr)
         timeFull->start();

      assign2productFull(A, x);
      setupStatus = false;

      if(timeFull != nullptr)
         timeFull->stop();

      ++nCallsFull;
   }

   assert(isConsistent());

   return *this;
}